

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O2

void __thiscall
gvr::MultiTexturedMesh::savePLY(MultiTexturedMesh *this,char *plyname,bool all,ply_encoding enc)

{
  uint __fd;
  pointer pbVar1;
  undefined4 uVar2;
  size_t __n;
  undefined7 in_register_00000011;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX_00;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX_01;
  void *__buf_06;
  void *__buf_07;
  void *extraout_RDX_02;
  void *pvVar3;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  char cVar4;
  int i_1;
  int __fd_00;
  string *name;
  int i;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  allocator local_2a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined4 local_27c;
  PLYWriter ply;
  
  local_27c = (undefined4)CONCAT71(in_register_00000011,all);
  PLYWriter::PLYWriter(&ply);
  PLYWriter::open(&ply,plyname,enc);
  Model::setOriginToPLY((Model *)this,&ply);
  lVar6 = 0;
  for (uVar8 = 0;
      pbVar1 = (this->name).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(this->name).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar8 = uVar8 + 1) {
    std::operator+(&local_2a0,"TextureFile ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(pbVar1->_M_dataplus)._M_p + (lVar6 >> 0x1b)));
    PLYWriter::addComment(&ply,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    lVar6 = lVar6 + 0x100000000;
  }
  std::__cxx11::string::string((string *)&local_2a0,"vertex",&local_2a1);
  PLYWriter::addElement(&ply,&local_2a0,(long)(this->super_Mesh).super_PointCloud.n);
  uVar2 = local_27c;
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2a0,"x",&local_2a1);
  PLYWriter::addProperty(&ply,&local_2a0,ply_float32);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2a0,"y",&local_2a1);
  PLYWriter::addProperty(&ply,&local_2a0,ply_float32);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2a0,"z",&local_2a1);
  PLYWriter::addProperty(&ply,&local_2a0,ply_float32);
  std::__cxx11::string::~string((string *)&local_2a0);
  cVar4 = (char)uVar2;
  if ((this->super_Mesh).super_PointCloud.scanprop == (float *)0x0) {
    if (cVar4 == '\0') goto LAB_00123512;
  }
  else {
    std::__cxx11::string::string((string *)&local_2a0,"scan_size",&local_2a1);
    PLYWriter::addProperty(&ply,&local_2a0,ply_float32);
    std::__cxx11::string::~string((string *)&local_2a0);
    if (cVar4 == '\0') goto LAB_00123512;
    std::__cxx11::string::string((string *)&local_2a0,"scan_error",&local_2a1);
    PLYWriter::addProperty(&ply,&local_2a0,ply_float32);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::string((string *)&local_2a0,"scan_conf",&local_2a1);
    PLYWriter::addProperty(&ply,&local_2a0,ply_float32);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
    std::__cxx11::string::string((string *)&local_2a0,"sx",&local_2a1);
    PLYWriter::addProperty(&ply,&local_2a0,ply_float32);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::string((string *)&local_2a0,"sy",&local_2a1);
    PLYWriter::addProperty(&ply,&local_2a0,ply_float32);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::string((string *)&local_2a0,"sz",&local_2a1);
    PLYWriter::addProperty(&ply,&local_2a0,ply_float32);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  std::__cxx11::string::string((string *)&local_2a0,"nx",&local_2a1);
  PLYWriter::addProperty(&ply,&local_2a0,ply_float32);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2a0,"ny",&local_2a1);
  PLYWriter::addProperty(&ply,&local_2a0,ply_float32);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2a0,"nz",&local_2a1);
  PLYWriter::addProperty(&ply,&local_2a0,ply_float32);
  std::__cxx11::string::~string((string *)&local_2a0);
LAB_00123512:
  std::__cxx11::string::string((string *)&local_2a0,"face",&local_2a1);
  PLYWriter::addElement(&ply,&local_2a0,(long)(this->super_Mesh).n);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2a0,"vertex_indices",&local_2a1);
  PLYWriter::addProperty(&ply,&local_2a0,ply_uint8,ply_uint32);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2a0,"texcoord",&local_2a1);
  __n = 7;
  PLYWriter::addProperty(&ply,&local_2a0,ply_uint8,ply_float32);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2a0,"texnumber",&local_2a1);
  name = &local_2a0;
  PLYWriter::addProperty(&ply,name,ply_int32);
  std::__cxx11::string::~string((string *)&local_2a0);
  lVar6 = 0;
  pvVar3 = extraout_RDX;
  do {
    if ((this->super_Mesh).super_PointCloud.n <= lVar6) {
      lVar5 = 0;
      lVar7 = 0;
      for (lVar6 = 0; lVar6 < (this->super_Mesh).n; lVar6 = lVar6 + 1) {
        PLYWriter::writeListSize(&ply,3);
        PLYWriter::write(&ply,*(int *)((long)(this->super_Mesh).triangle + lVar5),__buf_08,__n);
        PLYWriter::write(&ply,*(int *)((long)(this->super_Mesh).triangle + lVar5 + 4),__buf_09,__n);
        PLYWriter::write(&ply,*(int *)((long)(this->super_Mesh).triangle + lVar5 + 8),__buf_10,__n);
        __fd_00 = 6;
        PLYWriter::writeListSize(&ply,6);
        PLYWriter::write(&ply,__fd_00,__buf_11,__n);
        PLYWriter::write(&ply,__fd_00,__buf_12,__n);
        PLYWriter::write(&ply,__fd_00,__buf_13,__n);
        PLYWriter::write(&ply,__fd_00,__buf_14,__n);
        PLYWriter::write(&ply,__fd_00,__buf_15,__n);
        PLYWriter::write(&ply,__fd_00,__buf_16,__n);
        __fd = *(uint *)((long)this->uvt->uv + lVar7 + 0x18);
        name = (string *)(ulong)__fd;
        PLYWriter::write(&ply,__fd,__buf_17,__n);
        lVar7 = lVar7 + 0x1c;
        lVar5 = lVar5 + 0xc;
      }
      PLYWriter::close(&ply,(int)name);
      PLYWriter::~PLYWriter(&ply);
      return;
    }
    PLYWriter::write(&ply,(int)name,pvVar3,__n);
    PLYWriter::write(&ply,(int)name,__buf,__n);
    PLYWriter::write(&ply,(int)name,__buf_00,__n);
    if ((this->super_Mesh).super_PointCloud.scanprop == (float *)0x0) {
      pvVar3 = __buf_01;
      if (cVar4 != '\0') goto LAB_0012369a;
    }
    else {
      PLYWriter::write(&ply,(int)name,__buf_01,__n);
      pvVar3 = __buf_02;
      if (cVar4 != '\0') {
        PLYWriter::write(&ply,(int)name,__buf_02,__n);
        PLYWriter::write(&ply,(int)name,__buf_03,__n);
        pvVar3 = extraout_RDX_00;
LAB_0012369a:
        if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
          PLYWriter::write(&ply,(int)name,pvVar3,__n);
          PLYWriter::write(&ply,(int)name,__buf_04,__n);
          PLYWriter::write(&ply,(int)name,__buf_05,__n);
          pvVar3 = extraout_RDX_01;
        }
        PLYWriter::write(&ply,(int)name,pvVar3,__n);
        PLYWriter::write(&ply,(int)name,__buf_06,__n);
        PLYWriter::write(&ply,(int)name,__buf_07,__n);
        pvVar3 = extraout_RDX_02;
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void MultiTexturedMesh::savePLY(const char *plyname, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  ply.open(plyname, enc);

  // define header

  setOriginToPLY(ply);

  for (size_t i=0; i<name.size(); i++)
  {
    ply.addComment("TextureFile "+getTextureName(static_cast<int>(i)));
  }

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  if (all)
  {
    ply.addProperty("nx", ply_float32);
    ply.addProperty("ny", ply_float32);
    ply.addProperty("nz", ply_float32);
  }

  ply.addElement("face", getTriangleCount());
  ply.addProperty("vertex_indices", ply_uint8, ply_uint32);
  ply.addProperty("texcoord", ply_uint8, ply_float32);
  ply.addProperty("texnumber", ply_int32);

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }

    if (all)
    {
      ply.write(getNormalComp(i, 0));
      ply.write(getNormalComp(i, 1));
      ply.write(getNormalComp(i, 2));
    }
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    ply.writeListSize(3);
    ply.write(getTriangleIndex(i, 0));
    ply.write(getTriangleIndex(i, 1));
    ply.write(getTriangleIndex(i, 2));

    ply.writeListSize(6);
    ply.write(getTextureCoordComp(i, 0, 0));
    ply.write(getTextureCoordComp(i, 0, 1));
    ply.write(getTextureCoordComp(i, 1, 0));
    ply.write(getTextureCoordComp(i, 1, 1));
    ply.write(getTextureCoordComp(i, 2, 0));
    ply.write(getTextureCoordComp(i, 2, 1));

    ply.write(getTextureIndex(i));
  }

  ply.close();
}